

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O0

bool __thiscall irr::scene::CSceneManager::isCulled(CSceneManager *this,ISceneNode *node)

{
  vector3d<float> *pvVar1;
  bool bVar2;
  u32 uVar3;
  int iVar4;
  EIntersectionRelation3D EVar5;
  undefined8 *puVar6;
  SViewFrustum *pSVar7;
  aabbox3d<float> *other;
  ISceneNode *in_RSI;
  long *in_RDI;
  vector3d<float> vVar8;
  vector3df vVar9;
  u32 j;
  bool boxInFrustum;
  s32 i;
  vector3df edges [8];
  matrix4 invTrans;
  SViewFrustum frust;
  float maxdist;
  float dist;
  vector3df camcenter;
  float camrad;
  vector3df center;
  float rad;
  aabbox3df nbox;
  aabbox3d<float> tbox;
  bool result;
  ICameraSceneNode *cam;
  vector3d<float> *this_00;
  vector3d<float> *in_stack_fffffffffffffd58;
  plane3d<float> *this_01;
  SViewFrustum *in_stack_fffffffffffffd60;
  uint local_284;
  undefined4 in_stack_fffffffffffffd80;
  uint uVar10;
  undefined4 in_stack_fffffffffffffd84;
  SViewFrustum *in_stack_fffffffffffffd88;
  float in_stack_fffffffffffffd90;
  eConstructor in_stack_fffffffffffffd94;
  CMatrix4<float> *in_stack_fffffffffffffd98;
  CMatrix4<float> *in_stack_fffffffffffffda0;
  plane3d<float> apStack_218 [21];
  float local_bc;
  vector3d<float> local_b8;
  vector3d<float> local_a8;
  float local_9c;
  vector3df local_98;
  undefined8 local_88;
  float local_80;
  float local_7c;
  vector3d<float> local_78;
  undefined8 local_68;
  float local_60;
  float local_58;
  aabbox3d<float> local_3c;
  byte local_21;
  long *local_20;
  ISceneNode *local_18;
  bool local_1;
  undefined4 extraout_var;
  
  local_18 = in_RSI;
  local_20 = (long *)(**(code **)(*in_RDI + 0x70))();
  if (local_20 == (long *)0x0) {
    local_1 = false;
  }
  else {
    local_21 = 0;
    uVar3 = ISceneNode::getAutomaticCulling(local_18);
    if ((uVar3 & 8) != 0) {
      iVar4 = (**(code **)(*(long *)in_RDI[0x1d] + 0x108))((long *)in_RDI[0x1d],local_18);
      local_21 = iVar4 == 0;
    }
    if (((local_21 & 1) == 0) &&
       (uVar3 = ISceneNode::getAutomaticCulling(local_18), (uVar3 & 1) != 0)) {
      iVar4 = (*local_18->_vptr_ISceneNode[7])();
      puVar6 = (undefined8 *)CONCAT44(extraout_var,iVar4);
      local_3c.MinEdge._0_8_ = *puVar6;
      local_3c._8_8_ = puVar6[1];
      local_3c.MaxEdge._4_8_ = puVar6[2];
      (*local_18->_vptr_ISceneNode[10])();
      core::CMatrix4<float>::transformBoxEx
                ((CMatrix4<float> *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 (aabbox3d<float> *)in_stack_fffffffffffffd88);
      pSVar7 = (SViewFrustum *)(**(code **)(*local_20 + 0x1b0))();
      other = SViewFrustum::getBoundingBox(pSVar7);
      bVar2 = core::aabbox3d<float>::intersectsWithBox(&local_3c,other);
      local_21 = (bVar2 ^ 0xffU) & 1;
    }
    if (((local_21 & 1) == 0) &&
       (uVar3 = ISceneNode::getAutomaticCulling(local_18), (uVar3 & 4) != 0)) {
      (*local_18->_vptr_ISceneNode[8])();
      local_58 = core::aabbox3d<float>::getRadius((aabbox3d<float> *)in_stack_fffffffffffffd60);
      vVar8 = core::aabbox3d<float>::getCenter
                        ((aabbox3d<float> *)
                         CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
      local_78.Z = vVar8.Z;
      local_60 = local_78.Z;
      local_78._0_8_ = vVar8._0_8_;
      local_68._0_4_ = local_78.X;
      local_68._4_4_ = local_78.Y;
      local_78 = vVar8;
      pSVar7 = (SViewFrustum *)(**(code **)(*local_20 + 0x1b0))();
      local_7c = SViewFrustum::getBoundingRadius(pSVar7);
      pSVar7 = (SViewFrustum *)(**(code **)(*local_20 + 0x1b0))();
      vVar9 = SViewFrustum::getBoundingCenter(pSVar7);
      local_98.Z = vVar9.Z;
      local_80 = local_98.Z;
      local_98._0_8_ = vVar9._0_8_;
      local_88._0_4_ = local_98.X;
      local_88._4_4_ = local_98.Y;
      local_98 = vVar9;
      vVar8 = core::vector3d<float>::operator-
                        (&in_stack_fffffffffffffd60->cameraPosition,in_stack_fffffffffffffd58);
      local_b8._0_8_ = vVar8._0_8_;
      local_a8.X = local_b8.X;
      local_a8.Y = local_b8.Y;
      local_b8.Z = vVar8.Z;
      local_a8.Z = local_b8.Z;
      local_b8 = vVar8;
      local_9c = core::vector3d<float>::getLengthSQ(&local_a8);
      local_bc = (local_58 + local_7c) * (local_58 + local_7c);
      local_21 = local_bc < local_9c;
    }
    if (((local_21 & 1) == 0) &&
       (uVar3 = ISceneNode::getAutomaticCulling(local_18), (uVar3 & 2) != 0)) {
      (**(code **)(*local_20 + 0x1b0))();
      SViewFrustum::SViewFrustum
                ((SViewFrustum *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 in_stack_fffffffffffffd88);
      (*local_18->_vptr_ISceneNode[10])();
      core::CMatrix4<float>::CMatrix4
                (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd94);
      SViewFrustum::transform(in_stack_fffffffffffffd60,(matrix4 *)in_stack_fffffffffffffd58);
      this_01 = apStack_218;
      pvVar1 = (vector3d<float> *)&stack0xfffffffffffffd88;
      do {
        this_00 = pvVar1;
        core::vector3d<float>::vector3d(this_00);
        pvVar1 = this_00 + 1;
      } while ((plane3d<float> *)(this_00 + 1) != this_01);
      (*local_18->_vptr_ISceneNode[7])();
      core::aabbox3d<float>::getEdges
                ((aabbox3d<float> *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 &in_stack_fffffffffffffd88->cameraPosition);
      for (iVar4 = 0; iVar4 < 6; iVar4 = iVar4 + 1) {
        uVar10 = 0;
        for (local_284 = 0; local_284 < 8; local_284 = local_284 + 1) {
          EVar5 = core::plane3d<float>::classifyPointRelation(this_01,this_00);
          if (EVar5 != ISREL3D_FRONT) {
            uVar10 = 0x1000000;
            break;
          }
        }
        if ((uVar10 & 0x1000000) == 0) {
          local_21 = 1;
          break;
        }
      }
    }
    local_1 = (bool)(local_21 & 1);
  }
  return local_1;
}

Assistant:

bool CSceneManager::isCulled(const ISceneNode *node) const
{
	const ICameraSceneNode *cam = getActiveCamera();
	if (!cam) {
		return false;
	}
	bool result = false;

	// has occlusion query information
	if (node->getAutomaticCulling() & scene::EAC_OCC_QUERY) {
		result = (Driver->getOcclusionQueryResult(const_cast<ISceneNode *>(node)) == 0);
	}

	// can be seen by a bounding box ?
	if (!result && (node->getAutomaticCulling() & scene::EAC_BOX)) {
		core::aabbox3d<f32> tbox = node->getBoundingBox();
		node->getAbsoluteTransformation().transformBoxEx(tbox);
		result = !(tbox.intersectsWithBox(cam->getViewFrustum()->getBoundingBox()));
	}

	// can be seen by a bounding sphere
	if (!result && (node->getAutomaticCulling() & scene::EAC_FRUSTUM_SPHERE)) {
		const core::aabbox3df nbox = node->getTransformedBoundingBox();
		const float rad = nbox.getRadius();
		const core::vector3df center = nbox.getCenter();

		const float camrad = cam->getViewFrustum()->getBoundingRadius();
		const core::vector3df camcenter = cam->getViewFrustum()->getBoundingCenter();

		const float dist = (center - camcenter).getLengthSQ();
		const float maxdist = (rad + camrad) * (rad + camrad);

		result = dist > maxdist;
	}

	// can be seen by cam pyramid planes ?
	if (!result && (node->getAutomaticCulling() & scene::EAC_FRUSTUM_BOX)) {
		SViewFrustum frust = *cam->getViewFrustum();

		// transform the frustum to the node's current absolute transformation
		core::matrix4 invTrans(node->getAbsoluteTransformation(), core::matrix4::EM4CONST_INVERSE);
		// invTrans.makeInverse();
		frust.transform(invTrans);

		core::vector3df edges[8];
		node->getBoundingBox().getEdges(edges);

		for (s32 i = 0; i < scene::SViewFrustum::VF_PLANE_COUNT; ++i) {
			bool boxInFrustum = false;
			for (u32 j = 0; j < 8; ++j) {
				if (frust.planes[i].classifyPointRelation(edges[j]) != core::ISREL3D_FRONT) {
					boxInFrustum = true;
					break;
				}
			}

			if (!boxInFrustum) {
				result = true;
				break;
			}
		}
	}

	return result;
}